

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IEnumerableCore.hpp
# Opt level: O0

IEnumerableCore<linq::ConcatState<linq::IEnumerable<int>,_linq::IEnumerable<int>,_int>_> *
__thiscall
linq::IEnumerable<int>::Concat<linq::IEnumerable<int>&>
          (IEnumerableCore<linq::ConcatState<linq::IEnumerable<int>,_linq::IEnumerable<int>,_int>_>
           *__return_storage_ptr__,IEnumerable<int> *this,IEnumerable<int> *other)

{
  IEnumerableCore<linq::IEnumerable<int>_> local_38;
  IEnumerable<int> *local_20;
  IEnumerable<int> *other_local;
  IEnumerable<int> *this_local;
  
  local_20 = other;
  other_local = this;
  this_local = (IEnumerable<int> *)__return_storage_ptr__;
  IEnumerableCore<linq::IEnumerable<int>_>::IEnumerableCore(&local_38,this);
  IEnumerableCore<linq::IEnumerable<int>>::Concat<linq::IEnumerable<int>&>
            (__return_storage_ptr__,&local_38,local_20);
  IEnumerableCore<linq::IEnumerable<int>_>::~IEnumerableCore(&local_38);
  return __return_storage_ptr__;
}

Assistant:

auto IEnumerable<T>::Concat(S2&& other) { return IEnumerableCore<IEnumerable<T>>(std::move(*this)).Concat(other); }